

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
          (InterpolationBase *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  double dVar1;
  long lVar2;
  int iVar3;
  pointer plVar4;
  pointer args;
  long lVar5;
  double dVar6;
  int MT_local;
  int MF_local;
  int MAT_local;
  double local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_58 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl;
  local_40 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
  local_48 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl;
  plVar4 = (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50 = (long)plVar4 -
             (long)(this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_38 = plVar4[-1];
  MT_local = MT;
  MF_local = MF;
  MAT_local = MAT;
  tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
            ((this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl,it);
  tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>(local_58,it);
  tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
            (&local_40,it);
  tools::disco::
  Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,int,int,int>
            (it,&local_48,&local_50,&local_38,&MAT_local,&MF_local,&MT_local);
  plVar4 = (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)plVar4 >> 3;
  lVar5 = lVar2 / 3;
  local_58 = (double)(lVar2 % 3);
  args = (this->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (4 < lVar2 + 2U) {
    do {
      tools::disco::
      Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
      ::
      write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,long,long,long,int,int,int>
                (it,plVar4,args,plVar4 + 1,args + 1,plVar4 + 2,args + 2,&MAT_local,&MF_local,
                 &MT_local);
      plVar4 = plVar4 + 3;
      args = args + 3;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  dVar1 = local_58;
  dVar6 = local_58;
  if (local_58 != 0.0) {
    do {
      tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
                (plVar4,it);
      tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
                (args,it);
      plVar4 = plVar4 + 1;
      args = args + 1;
      dVar6 = (double)((long)dVar6 + -1);
    } while (dVar6 != 0.0);
    if (dVar1 != 1.48219693752374e-323) {
      lVar5 = (long)dVar1 * -2 + 6;
      do {
        iVar3 = 0xb;
        do {
          std::__cxx11::string::push_back((char)it->container);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,&MAT_local,&MF_local,&MT_local);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;

  {
    using Format = disco::Record< disco::ENDF, disco::ENDF,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 4 >, disco::Integer< 2 >,
                                  disco::Integer< 3 >, disco::Column< 5 > >;
    Format::write( it,
                   this->C1(), this->C2(),
                   this->L1(), this->L2(),
                   this->NR(), this->N2(),
                   MAT, MF, MT );
  }
  {
    using Format = disco::Record< disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 4 >, disco::Integer< 2 >,
                                  disco::Integer< 3 >, disco::Column< 5 > >;

    auto nFullLines = this->NR() / 3;
    auto partialLineEntries = this->NR() - nFullLines * 3;

    auto boundary = this->boundaries().begin();
    auto interpolant = this->interpolants().begin();

    while ( nFullLines-- ){
      Format::write( it,
                     boundary[0], interpolant[0],
                     boundary[1], interpolant[1],
                     boundary[2], interpolant[2],
                     MAT, MF, MT );
      boundary += 3; interpolant += 3;
    }

    if ( partialLineEntries ){
      auto blankEntries = 2 * ( 3 - partialLineEntries );
      while ( partialLineEntries-- ){
        disco::Integer<11>::write( *boundary, it );
        disco::Integer<11>::write( *interpolant, it );
        ++boundary; ++interpolant;
      }

      while ( blankEntries-- ){ disco::Column< 11 >::write( it ); }

      using Format =
        disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                       disco::Integer< 3 >, disco::Column< 5 > >;

      Format::write( it, MAT, MF, MT );
    }
  }
}